

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_fixture.c
# Opt level: O0

char * srcdir_path(char *file)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  int local_28;
  int i;
  int len;
  char *p;
  char *file_local;
  
  pcVar2 = getenv("srcdir");
  if (file == (char *)0x0) {
    for (local_28 = 0; local_28 < srcdir_path::curpath; local_28 = local_28 + 1) {
      free(srcdir_path::filepath[srcdir_path::curpath]);
    }
    srcdir_path::curpath = 0;
    file_local = (char *)0x0;
  }
  else {
    if (0x1f < srcdir_path::curpath) {
      fprintf(_stderr,"srcdir_path ran out of filepath slots.\n");
    }
    if (0x1f < srcdir_path::curpath) {
      __assert_fail("curpath < NUMPATHS",
                    "/workspace/llm4binary/github/license_c_cmakelists/libssh2[P]libssh2/tests/session_fixture.c"
                    ,0x104,"char *srcdir_path(const char *)");
    }
    if (pcVar2 == (char *)0x0) {
      iVar1 = snprintf((char *)0x0,0,"%s",file);
      if (iVar1 < 1) {
        return (char *)0x0;
      }
      pcVar2 = (char *)calloc(1,(long)iVar1 + 1);
      srcdir_path::filepath[srcdir_path::curpath] = pcVar2;
      snprintf(srcdir_path::filepath[srcdir_path::curpath],(long)iVar1 + 1,"%s",file);
    }
    else {
      iVar1 = snprintf((char *)0x0,0,"%s/%s",pcVar2,file);
      if (iVar1 < 3) {
        return (char *)0x0;
      }
      pcVar3 = (char *)calloc(1,(long)iVar1 + 1);
      srcdir_path::filepath[srcdir_path::curpath] = pcVar3;
      snprintf(srcdir_path::filepath[srcdir_path::curpath],(long)iVar1 + 1,"%s/%s",pcVar2,file);
    }
    file_local = srcdir_path::filepath[srcdir_path::curpath];
    srcdir_path::curpath = srcdir_path::curpath + 1;
  }
  return file_local;
}

Assistant:

char *srcdir_path(const char *file)
{
    static char *filepath[NUMPATHS];
    static int curpath;
    char *p = getenv("srcdir");
    if(file) {
        int len;
        if(curpath >= NUMPATHS) {
            fprintf(stderr, "srcdir_path ran out of filepath slots.\n");
        }
        assert(curpath < NUMPATHS);
        if(p) {
            len = snprintf(NULL, 0, "%s/%s", p, file);
            if(len > 2) {
                filepath[curpath] = calloc(1, (size_t)len + 1);
                snprintf(filepath[curpath], (size_t)len + 1, "%s/%s", p, file);
            }
            else {
               return NULL;
            }
        }
        else {
            len = snprintf(NULL, 0, "%s", file);
            if(len > 0) {
                filepath[curpath] = calloc(1, (size_t)len + 1);
                snprintf(filepath[curpath], (size_t)len + 1, "%s", file);
            }
            else {
               return NULL;
            }
        }
        return filepath[curpath++];
    }
    else {
        int i;
        for(i = 0; i < curpath; ++i) {
            free(filepath[curpath]);
        }
        curpath = 0;
        return NULL;
    }
}